

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,string *name)

{
  string *source;
  uint uVar1;
  string dir;
  
  cmsys::SystemTools::CollapseFullPath(&dir,name);
  std::__cxx11::string::operator=((string *)this,(string *)&dir);
  std::__cxx11::string::~string((string *)&dir);
  source = &this->TempName;
  std::__cxx11::string::_M_assign((string *)source);
  std::__cxx11::string::append((char *)source);
  if ((this->TempExt)._M_string_length == 0) {
    uVar1 = cmSystemTools::RandomSeed();
    snprintf((char *)&dir,0x40,"tmp%05x",(ulong)(uVar1 & 0xfffff));
    std::__cxx11::string::append((char *)source);
  }
  else {
    std::__cxx11::string::append((string *)source);
  }
  cmsys::SystemTools::RemoveFile(source);
  cmsys::SystemTools::GetFilenamePath(&dir,source);
  cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(std::string const& name)
{
  // Save the original name of the file.
  this->Name = cmSystemTools::CollapseFullPath(name);

  // Create the name of the temporary file.
  this->TempName = this->Name;
#if defined(__VMS)
  this->TempName += "_";
#else
  this->TempName += ".";
#endif
  if (!this->TempExt.empty()) {
    this->TempName += this->TempExt;
  } else {
    char buf[64];
    snprintf(buf, sizeof(buf), "tmp%05x",
             cmSystemTools::RandomSeed() & 0xFFFFF);
    this->TempName += buf;
  }

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir);
}